

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterWriteDTD
              (xmlTextWriterPtr writer,xmlChar *name,xmlChar *pubid,xmlChar *sysid,xmlChar *subset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = xmlTextWriterStartDTD(writer,name,pubid,sysid);
  iVar3 = -1;
  if (iVar1 != -1) {
    if (subset != (xmlChar *)0x0) {
      iVar2 = xmlTextWriterWriteString(writer,subset);
      if (iVar2 == -1) {
        return -1;
      }
      iVar1 = iVar1 + iVar2;
    }
    iVar2 = xmlTextWriterEndDTD(writer);
    if (iVar2 != -1) {
      iVar3 = iVar2 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int
xmlTextWriterWriteDTD(xmlTextWriterPtr writer,
                      const xmlChar * name,
                      const xmlChar * pubid,
                      const xmlChar * sysid, const xmlChar * subset)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartDTD(writer, name, pubid, sysid);
    if (count == -1)
        return -1;
    sum += count;
    if (subset != 0) {
        count = xmlTextWriterWriteString(writer, subset);
        if (count == -1)
            return -1;
        sum += count;
    }
    count = xmlTextWriterEndDTD(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}